

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExtractor_impl.hpp
# Opt level: O2

void __thiscall
hiberlite::ExtractModel::
act<hiberlite::AVisitor<hiberlite::ExtractModel>,std::vector<int,std::allocator<int>>,hiberlite::stl_stream_adapter<std::vector<int,std::allocator<int>>,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
          (ExtractModel *this,AVisitor<hiberlite::ExtractModel> *av,
          collection_nvp<std::vector<int,_std::allocator<int>_>,_hiberlite::stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
          *nvp)

{
  vector<int,_std::allocator<int>_> *_value;
  allocator local_1da;
  allocator local_1d9;
  sql_nvp<std::vector<int,_std::allocator<int>_>_> el;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  sql_nvp<std::vector<int,_std::allocator<int>_>_> local_70;
  
  _value = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  (_value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (_value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (_value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_90,(string *)nvp);
  AVisitor<hiberlite::ExtractModel>::diveTable(av,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  Scope::Scope((Scope *)&el,&av->scope);
  std::__cxx11::string::string((string *)&local_b0,(string *)&el);
  std::__cxx11::string::string((string *)&local_d0,"hiberlite_parent_id",&local_1d9);
  std::__cxx11::string::string((string *)&local_f0,"INTEGER",&local_1da);
  putNamedColumn(this,&local_b0,&local_d0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  Scope::~Scope((Scope *)&el);
  Scope::Scope((Scope *)&el,&av->scope);
  std::__cxx11::string::string((string *)&local_110,(string *)&el);
  std::__cxx11::string::string((string *)&local_130,"hiberlite_entry_indx",&local_1d9);
  std::__cxx11::string::string((string *)&local_150,"INTEGER",&local_1da);
  putNamedColumn(this,&local_110,&local_130,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  Scope::~Scope((Scope *)&el);
  std::__cxx11::string::string((string *)&local_170,"item",&local_1d9);
  std::__cxx11::string::string((string *)&local_190,"",&local_1da);
  sql_nvp<std::vector<int,_std::allocator<int>_>_>::sql_nvp(&el,&local_170,_value,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  sql_nvp<std::vector<int,_std::allocator<int>_>_>::sql_nvp(&local_70,&el);
  AVisitor<hiberlite::ExtractModel>::operator&(av,&local_70);
  sql_nvp<std::vector<int,_std::allocator<int>_>_>::~sql_nvp(&local_70);
  AVisitor<hiberlite::ExtractModel>::popScope(av);
  access::destroy<hiberlite::ExtractModel,std::vector<int,std::allocator<int>>>(this,_value);
  sql_nvp<std::vector<int,_std::allocator<int>_>_>::~sql_nvp(&el);
  return;
}

Assistant:

void ExtractModel::act(AV& av, collection_nvp<E,S> nvp )
{
	E* entry;
	construct(av, &entry, static_cast<unsigned int>(0));
		av.diveTable(nvp.name);

			putNamedColumn(av.getScope().table(), HIBERLITE_PARENTID_COLUMN, HIBERLITE_ID_STORAGE_CLASS);
			putNamedColumn(av.getScope().table(), HIBERLITE_ENTRY_INDEX_COLUMN, HIBERLITE_ID_STORAGE_CLASS);

			sql_nvp<E> el("item",*entry);
			av & el;
		av.pop();
	destroy(*this, entry, static_cast<unsigned int>(0));
}